

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O1

char ** cmsysSystem_Parse_CommandForUnix(char *command,int flags)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char **ppcVar7;
  int iVar8;
  ushort **ppuVar9;
  char **__dest;
  byte *pbVar10;
  size_t __n;
  char **ppcVar11;
  byte c;
  int buffer_size;
  char *buffer_begin;
  char **local_558;
  char **pointer_begin;
  char *local_548;
  int pointers_size;
  char *local_pointers [32];
  char local_buffer [1024];
  
  __dest = (char **)0x0;
  bVar5 = false;
  if (flags == 0) {
    pointers_size = 0x20;
    local_558 = local_pointers;
    buffer_size = 0x400;
    buffer_begin = local_buffer;
    c = *command;
    pointer_begin = local_558;
    local_548 = buffer_begin;
    if (c == 0) {
      bVar3 = true;
    }
    else {
      pbVar10 = (byte *)(command + 1);
      bVar6 = false;
      bVar2 = false;
      bVar1 = false;
      bVar4 = false;
      bVar3 = false;
      do {
        if (bVar1) {
LAB_00135908:
          iVar8 = kwsysSystem__AppendByte(local_buffer,&buffer_begin,&local_548,&buffer_size,c);
          bVar4 = true;
          if (iVar8 == 0) {
LAB_00135a06:
            bVar3 = true;
            bVar5 = true;
            goto LAB_00135a0b;
          }
          bVar1 = false;
          bVar3 = true;
        }
        else {
          bVar1 = true;
          if (c != 0x5c) {
            if ((c != 0x27) || (bVar6)) {
              if (bVar2 || c != 0x22) {
                ppuVar9 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar9 + (ulong)c * 2 + 1) & 0x20) == 0) goto LAB_00135908;
                bVar1 = false;
                if (bVar3) {
                  if (!bVar2 && !bVar6) {
                    iVar8 = kwsysSystem__AppendArgument
                                      (local_pointers,&pointer_begin,&local_558,&pointers_size,
                                       local_buffer,&buffer_begin,&local_548,&buffer_size);
                    if (iVar8 != 0) {
                      bVar3 = false;
                      bVar2 = false;
                      bVar4 = bVar3;
                      goto LAB_001358db;
                    }
                    goto LAB_00135a06;
                  }
                  iVar8 = kwsysSystem__AppendByte
                                    (local_buffer,&buffer_begin,&local_548,&buffer_size,c);
                  bVar4 = true;
                  bVar3 = true;
                  bVar5 = true;
                  if (iVar8 == 0) goto LAB_00135a0b;
                }
                else {
                  bVar4 = false;
                  bVar3 = bVar4;
                }
              }
              else {
                bVar6 = !bVar6;
                if (bVar6) {
                  bVar4 = true;
                }
                bVar1 = false;
                bVar2 = false;
                bVar3 = bVar4;
              }
            }
            else {
              bVar2 = !bVar2;
              if (bVar2) {
                bVar4 = true;
                bVar3 = true;
              }
LAB_001358db:
              bVar1 = false;
              bVar6 = false;
            }
          }
        }
        c = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (c != 0);
      bVar5 = false;
LAB_00135a0b:
      bVar3 = !bVar3;
    }
    if ((!bVar3) &&
       (iVar8 = kwsysSystem__AppendArgument
                          (local_pointers,&pointer_begin,&local_558,&pointers_size,local_buffer,
                           &buffer_begin,&local_548,&buffer_size), iVar8 == 0)) {
      bVar5 = true;
    }
    if (bVar5) {
      __dest = (char **)0x0;
    }
    else {
      __dest = (char **)malloc((long)local_558 + (8 - (long)pointer_begin));
    }
    ppcVar7 = pointer_begin;
    ppcVar11 = local_558;
    if (__dest == (char **)0x0) {
      for (; ppcVar11 != ppcVar7; ppcVar11 = ppcVar11 + -1) {
        free(ppcVar11[-1]);
      }
    }
    else {
      __n = (long)local_558 - (long)pointer_begin;
      memcpy(__dest,pointer_begin,__n);
      *(undefined8 *)((long)__dest + __n) = 0;
      ppcVar11 = local_558;
    }
    local_558 = ppcVar11;
    if (pointer_begin != local_pointers) {
      free(pointer_begin);
    }
    if (buffer_begin != local_buffer) {
      free(buffer_begin);
    }
  }
  return __dest;
}

Assistant:

char** kwsysSystem_Parse_CommandForUnix(const char* command, int flags)
{
  /* Validate the flags.  */
  if(flags != 0)
    {
    return 0;
    }

  /* Forward to our internal implementation.  */
  return kwsysSystem__ParseUnixCommand(command, flags);
}